

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

int Utils::getCountOfBytesBeforeNullTerminatorInt(const_iterator it)

{
  reference puVar1;
  bool bVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  const_iterator itCopy;
  int countBytesBeforeNullTerminated;
  const_iterator it_local;
  
  itCopy._M_current._4_4_ = 0;
  local_20._M_current = it._M_current;
  while( true ) {
    puVar1 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_20);
    bVar2 = false;
    if (*puVar1 != 0) {
      local_28 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+(&local_20,1);
      puVar1 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_28);
      bVar2 = *puVar1 != 0;
    }
    if (!bVar2) break;
    itCopy._M_current._4_4_ = itCopy._M_current._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_20);
  }
  return itCopy._M_current._4_4_ + 3;
}

Assistant:

int Utils::getCountOfBytesBeforeNullTerminatorInt(std::vector<unsigned int>::const_iterator it) {
    int countBytesBeforeNullTerminated = 0;
    auto itCopy = it;
    // Получаем сколько байт нужно считать до нультермитатора
    while ((int)*itCopy != 0x00 && (int)*(itCopy + 1) != 0x00 ) {
        ++countBytesBeforeNullTerminated;
        ++itCopy;
    }
    return countBytesBeforeNullTerminated + 3;
}